

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaDevice.cpp
# Opt level: O2

void __thiscall
xmrig::CudaDevice::CudaDevice(CudaDevice *this,uint32_t index,int32_t bfactor,int32_t bsleep)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  nvid_ctx *ctx;
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX *src;
  
  this->m_index = index;
  this->m_ctx = (nvid_ctx *)0x0;
  (this->m_topology).m_valid = false;
  (this->m_topology).m_bus = '\0';
  (this->m_topology).m_device = '\0';
  (this->m_topology).m_function = '\0';
  (this->m_name).m_data = (char *)0x0;
  (this->m_name).m_size = 0;
  this->m_nvmlDevice = (nvmlDevice_t)0x0;
  ctx = CudaLib::alloc(index,bfactor,bsleep);
  iVar1 = CudaLib::deviceInfo(ctx,0,0);
  if (iVar1 != 0) {
    CudaLib::release(ctx);
    return;
  }
  this->m_ctx = ctx;
  dst = (EVP_PKEY_CTX *)CudaLib::deviceName(ctx);
  String::copy(&this->m_name,dst,src);
  uVar2 = CudaLib::deviceUint(ctx,DevicePciBusID);
  uVar3 = CudaLib::deviceUint(ctx,DevicePciDeviceID);
  this->m_topology = (PciTopology)((uVar3 & 0xff) * 0x10000 + (uVar2 & 0xff) * 0x100 + 1);
  return;
}

Assistant:

xmrig::CudaDevice::CudaDevice(uint32_t index, int32_t bfactor, int32_t bsleep) :
    m_index(index)
{
    auto ctx = CudaLib::alloc(index, bfactor, bsleep);
    if (CudaLib::deviceInfo(ctx, 0, 0) != 0) {
        CudaLib::release(ctx);

        return;
    }

    m_ctx       = ctx;
    m_name      = CudaLib::deviceName(ctx);
    m_topology  = PciTopology(CudaLib::deviceUint(ctx, CudaLib::DevicePciBusID), CudaLib::deviceUint(ctx, CudaLib::DevicePciDeviceID), 0);
}